

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmQtAutoGenerators.cxx
# Opt level: O2

void __thiscall cmQtAutoGenerators::LogWarning(cmQtAutoGenerators *this,string *message)

{
  string msg;
  
  std::__cxx11::string::string((string *)&msg,(string *)message);
  if (msg._M_string_length != 0) {
    if (msg._M_dataplus._M_p[msg._M_string_length - 1] != '\n') {
      std::__cxx11::string::push_back((char)&msg);
    }
    std::__cxx11::string::push_back((char)&msg);
    cmSystemTools::Stdout(msg._M_dataplus._M_p,msg._M_string_length);
  }
  std::__cxx11::string::~string((string *)&msg);
  return;
}

Assistant:

void cmQtAutoGenerators::LogWarning(const std::string& message) const
{
  std::string msg(message);
  if (!msg.empty()) {
    if (msg[msg.size() - 1] != '\n') {
      msg.push_back('\n');
    }
    // Append empty line
    msg.push_back('\n');
    cmSystemTools::Stdout(msg.c_str(), msg.size());
  }
}